

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::verifyStateIntegerEqualToOther
               (ResultCollector *result,CallLogWrapper *gl,GLenum target,GLenum other,QueryType type
               )

{
  QueriedState stateB;
  QueriedState stateA;
  string local_a8;
  ResultCollector *local_88;
  QueriedState local_80;
  QueriedState local_58;
  
  local_58.m_type = DATATYPE_LAST;
  local_80.m_type = DATATYPE_LAST;
  queryState(result,gl,type,target,&local_58);
  local_88 = result;
  queryState(result,gl,type,other,&local_80);
  if ((local_58.m_type != DATATYPE_LAST) && (local_80.m_type != DATATYPE_LAST)) {
    switch(type) {
    case QUERY_BOOLEAN:
      if (local_58.m_v.vBool == local_80.m_v.vBool) {
        return;
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"expected equal results","");
      tcu::ResultCollector::fail(local_88,&local_a8);
      break;
    default:
      goto switchD_009128f3_caseD_1;
    case QUERY_INTEGER:
      if (local_58.m_v.vInt == local_80.m_v.vInt) {
        return;
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"expected equal results","");
      tcu::ResultCollector::fail(local_88,&local_a8);
      break;
    case QUERY_INTEGER64:
      if (CONCAT44(local_58.m_v.vIntVec3[1],local_58.m_v.vInt) ==
          CONCAT44(local_80.m_v.vIntVec3[1],local_80.m_v.vInt)) {
        return;
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"expected equal results","");
      tcu::ResultCollector::fail(local_88,&local_a8);
      break;
    case QUERY_FLOAT:
      if ((local_58.m_v.vFloat == local_80.m_v.vFloat) &&
         (!NAN(local_58.m_v.vFloat) && !NAN(local_80.m_v.vFloat))) {
        return;
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"expected equal results","");
      tcu::ResultCollector::fail(local_88,&local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
switchD_009128f3_caseD_1:
  return;
}

Assistant:

void verifyStateIntegerEqualToOther (tcu::ResultCollector& result, glu::CallLogWrapper& gl, glw::GLenum target, glw::GLenum other, QueryType type)
{
	QueriedState stateA;
	QueriedState stateB;

	queryState(result, gl, type, target, stateA);
	queryState(result, gl, type, other, stateB);

	if (stateA.isUndefined() || stateB.isUndefined())
		return;

	switch (type)
	{
		case QUERY_BOOLEAN:
		{
			if (stateA.getBoolAccess() != stateB.getBoolAccess())
				result.fail("expected equal results");
			break;
		}

		case QUERY_INTEGER:
		{
			if (stateA.getIntAccess() != stateB.getIntAccess())
				result.fail("expected equal results");
			break;
		}

		case QUERY_INTEGER64:
		{
			if (stateA.getInt64Access() != stateB.getInt64Access())
				result.fail("expected equal results");
			break;
		}

		case QUERY_FLOAT:
		{
			if (stateA.getFloatAccess() != stateB.getFloatAccess())
				result.fail("expected equal results");
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}